

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# random_shuffle.hpp
# Opt level: O1

void bcl::
     random_shuffle<__gnu_cxx::__normal_iterator<unsigned_int*,std::vector<unsigned_int,std::allocator<unsigned_int>>>,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
               (__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                first,__normal_iterator<unsigned_int_*,_std::vector<unsigned_int,_std::allocator<unsigned_int>_>_>
                      last,
               mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
               *eng)

{
  uint uVar1;
  bool bVar2;
  int iVar3;
  _Adaptor<std::mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>,_double>
  __aurng;
  long lVar4;
  double dVar5;
  
  lVar4 = (long)last._M_current - (long)first._M_current >> 2;
  if (1 < lVar4) {
    do {
      dVar5 = std::
              generate_canonical<double,53ul,std::mersenne_twister_engine<unsigned_long,32ul,624ul,397ul,31ul,2567483615ul,11ul,4294967295ul,7ul,2636928640ul,15ul,4022730752ul,18ul,1812433253ul>>
                        (eng);
      iVar3 = (int)((dVar5 + 0.0) * (double)lVar4);
      uVar1 = *first._M_current;
      *first._M_current = first._M_current[iVar3];
      first._M_current[iVar3] = uVar1;
      first._M_current = first._M_current + 1;
      bVar2 = 2 < lVar4;
      lVar4 = lVar4 + -1;
    } while (bVar2);
  }
  return;
}

Assistant:

void random_shuffle(RandomAccessIter first, RandomAccessIter last,
                    ENGINE& eng) {
  std::uniform_real_distribution<> dist;
  using std::iter_swap;
  for (typename std::iterator_traits<RandomAccessIter>::difference_type
         n = last - first; n > 1; ++first, --n)
    iter_swap(first, first + (int)(n * dist(eng)));
}